

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

void BN_free(BIGNUM *a)

{
  uint uVar1;
  
  if (a != (BIGNUM *)0x0) {
    uVar1 = a->flags;
    if ((uVar1 & 2) == 0) {
      bn_free_d((BIGNUM *)a);
      uVar1 = a->flags;
    }
    if ((uVar1 & 1) != 0) {
      CRYPTO_free(a);
      return;
    }
    a->d = (ulong *)0x0;
  }
  return;
}

Assistant:

void BN_free(BIGNUM *a)
{
    if (a == NULL)
        return;
    bn_check_top(a);
    if (!BN_get_flags(a, BN_FLG_STATIC_DATA))
        bn_free_d(a);
    if (a->flags & BN_FLG_MALLOCED)
        CRYPTO_free(a);
    else {
// #if OPENSSL_API_COMPAT < 0x00908000L
//         a->flags |= BN_FLG_FREE;
// #endif
        a->d = NULL;
    }
}